

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O3

string * __thiscall
cmExtraCodeLiteGenerator::GetBuildCommand
          (string *__return_storage_ptr__,cmExtraCodeLiteGenerator *this,cmMakefile *mf,
          string *targetName)

{
  pointer pcVar1;
  int iVar2;
  string *psVar3;
  string *psVar4;
  ostream *poVar5;
  ostringstream ss;
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar1 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_GENERATOR","");
  psVar3 = cmMakefile::GetSafeDefinition(mf,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_MAKE_PROGRAM","");
  psVar4 = cmMakefile::GetRequiredDefinition(mf,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar4->_M_string_length);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  iVar2 = std::__cxx11::string::compare((char *)psVar3);
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)psVar3);
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)psVar3);
      if (iVar2 != 0) {
        iVar2 = std::__cxx11::string::compare((char *)psVar3);
        if (iVar2 != 0) goto LAB_0050e650;
      }
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," -f$(ProjectPath)/Makefile",0x1a);
      if (this->CpuCount != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," -j ",4);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      }
      goto LAB_0050e650;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
LAB_0050e650:
  if (targetName->_M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(targetName->_M_dataplus)._M_p,targetName->_M_string_length);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1c8);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeLiteGenerator::GetBuildCommand(
  const cmMakefile* mf, const std::string& targetName) const
{
  const std::string& generator = mf->GetSafeDefinition("CMAKE_GENERATOR");
  const std::string& make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string buildCommand = make; // Default
  std::ostringstream ss;
  if (generator == "NMake Makefiles" || generator == "Ninja") {
    ss << make;
  } else if (generator == "MinGW Makefiles" || generator == "Unix Makefiles") {
    ss << make << " -f$(ProjectPath)/Makefile";
    if (this->CpuCount > 0) {
      ss << " -j " << this->CpuCount;
    }
  }
  if (!targetName.empty()) {
    ss << " " << targetName;
  }
  buildCommand = ss.str();
  return buildCommand;
}